

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
InternalGetPropertyRecord
          (ScriptContext *scriptContext,RecyclableObject *key,PropertyRecord **propertyRecord)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptString *propertyString;
  JavascriptSymbol *pJVar5;
  
  if (propertyRecord == (PropertyRecord **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x5d4,"(propertyRecord != nullptr)","propertyRecord != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  *propertyRecord = (PropertyRecord *)0x0;
  TVar1 = ((key->type).ptr)->typeId;
  if (TVar1 == TypeIds_Symbol) {
    pJVar5 = Js::VarTo<Js::JavascriptSymbol,Js::RecyclableObject>(key);
    *propertyRecord = (pJVar5->propertyRecordUsageCache).propertyRecord.ptr;
  }
  else {
    if (TVar1 != TypeIds_String) {
      return JsErrorInvalidArgument;
    }
    propertyString = Js::VarTo<Js::JavascriptString,Js::RecyclableObject>(key);
    Js::ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,propertyRecord);
  }
  return JsNoError;
}

Assistant:

static JsErrorCode InternalGetPropertyRecord(Js::ScriptContext * scriptContext,
    Js::RecyclableObject * key, _Out_ const Js::PropertyRecord ** propertyRecord)
{
    Assert(propertyRecord != nullptr);
    *propertyRecord = nullptr;

    switch(key->GetTypeId())
    {
    case Js::TypeIds_String:
        scriptContext->GetOrAddPropertyRecord(Js::VarTo<Js::JavascriptString>(key),
            (Js::PropertyRecord const **)propertyRecord);
        break;
    case Js::TypeIds_Symbol:
        *propertyRecord = Js::VarTo<Js::JavascriptSymbol>(key)->GetValue();
        break;
    default:
        return JsErrorInvalidArgument;
    };

    return JsNoError;
}